

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcore_unix_p.h
# Opt level: O0

int qt_safe_open(char *pathname,int flags,mode_t mode)

{
  int iVar1;
  int *piVar2;
  uint in_EDX;
  uint in_ESI;
  char *in_RDI;
  bool bVar3;
  int fd;
  
  do {
    iVar1 = open64(in_RDI,in_ESI | 0x80000,(ulong)in_EDX);
    bVar3 = false;
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      bVar3 = *piVar2 == 4;
    }
  } while (bVar3);
  return iVar1;
}

Assistant:

static inline int qt_safe_open(const char *pathname, int flags, mode_t mode = 0777)
{
#ifdef O_CLOEXEC
    flags |= O_CLOEXEC;
#endif
    int fd;
    QT_EINTR_LOOP(fd, QT_OPEN(pathname, flags, mode));

#ifndef O_CLOEXEC
    if (fd != -1)
        ::fcntl(fd, F_SETFD, FD_CLOEXEC);
#endif

    return fd;
}